

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DGXMLScanner::scanAttrListforNameSpaces
          (DGXMLScanner *this,RefVectorOf<xercesc_4_0::XMLAttr> *theAttrList,XMLSize_t attCount,
          XMLElementDecl *elemDecl)

{
  RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  XMLAttr *pXVar5;
  XMLAttr **ppXVar6;
  XMLCh *pXVar7;
  XMLAttr *pXVar8;
  XMLCh *pXVar9;
  XMLAttr *local_60;
  XMLSize_t attrIndex;
  XMLAttr *loopAttr;
  XMLAttr *curAttr;
  XMLSize_t index;
  XMLAttr *pXStack_38;
  bool toUseHashTable;
  XMLAttr *providedAttr;
  XMLSize_t i;
  XMLElementDecl *elemDecl_local;
  XMLSize_t attCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *theAttrList_local;
  DGXMLScanner *this_local;
  
  i = (XMLSize_t)elemDecl;
  elemDecl_local = (XMLElementDecl *)attCount;
  attCount_local = (XMLSize_t)theAttrList;
  theAttrList_local = (RefVectorOf<xercesc_4_0::XMLAttr> *)this;
  for (providedAttr = (XMLAttr *)0x0; pXVar8 = providedAttr,
      pXVar5 = (XMLAttr *)ValueVectorOf<xercesc_4_0::XMLAttr_*>::size(this->fAttrNSList),
      pXVar8 < pXVar5; providedAttr = (XMLAttr *)&providedAttr->field_0x1) {
    ppXVar6 = ValueVectorOf<xercesc_4_0::XMLAttr_*>::elementAt
                        (this->fAttrNSList,(XMLSize_t)providedAttr);
    pXVar8 = *ppXVar6;
    pXStack_38 = pXVar8;
    pXVar7 = XMLAttr::getPrefix(pXVar8);
    uVar3 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar7,Mode_Attribute);
    XMLAttr::setURIId(pXVar8,uVar3);
  }
  ValueVectorOf<xercesc_4_0::XMLAttr_*>::removeAllElements(this->fAttrNSList);
  index._7_1_ = 0;
  XMLScanner::setAttrDupChkRegistry
            (&this->super_XMLScanner,(XMLSize_t *)&elemDecl_local,(bool *)((long)&index + 7));
  for (curAttr = (XMLAttr *)0x0; curAttr < elemDecl_local; curAttr = (XMLAttr *)&curAttr->field_0x1)
  {
    pXVar8 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                       ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)attCount_local,(XMLSize_t)curAttr);
    if ((index._7_1_ & 1) == 0) {
      for (local_60 = (XMLAttr *)0x0; local_60 < curAttr; local_60 = (XMLAttr *)&local_60->field_0x1
          ) {
        pXVar5 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                           ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)attCount_local,
                            (XMLSize_t)local_60);
        uVar3 = XMLAttr::getURIId(pXVar5);
        uVar4 = XMLAttr::getURIId(pXVar8);
        if (uVar3 == uVar4) {
          pXVar7 = XMLAttr::getName(pXVar5);
          pXVar9 = XMLAttr::getName(pXVar8);
          bVar2 = XMLString::equals(pXVar7,pXVar9);
          if (bVar2) {
            pXVar7 = XMLAttr::getName(pXVar8);
            pXVar9 = XMLElementDecl::getFullName((XMLElementDecl *)i);
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar7,pXVar9,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
        }
      }
    }
    else {
      pRVar1 = (this->super_XMLScanner).fAttrDupChkRegistry;
      pXVar7 = XMLAttr::getName(pXVar8);
      uVar3 = XMLAttr::getURIId(pXVar8);
      bVar2 = RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::containsKey
                        (pRVar1,pXVar7,uVar3);
      if (bVar2) {
        pXVar7 = XMLAttr::getName(pXVar8);
        pXVar9 = XMLElementDecl::getFullName((XMLElementDecl *)i);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar7,pXVar9,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      pRVar1 = (this->super_XMLScanner).fAttrDupChkRegistry;
      pXVar7 = XMLAttr::getName(pXVar8);
      uVar3 = XMLAttr::getURIId(pXVar8);
      RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::put
                (pRVar1,pXVar7,uVar3,pXVar8);
    }
  }
  return;
}

Assistant:

void DGXMLScanner::scanAttrListforNameSpaces(RefVectorOf<XMLAttr>* theAttrList, XMLSize_t attCount,
                                                XMLElementDecl*       elemDecl)
{
    // Map prefixes to uris
    for (XMLSize_t i=0; i < fAttrNSList->size(); i++) {
        XMLAttr* providedAttr = fAttrNSList->elementAt(i);
        providedAttr->setURIId(
            resolvePrefix(providedAttr->getPrefix(), ElemStack::Mode_Attribute)
        );
    }

    fAttrNSList->removeAllElements();

     // Decide if to use hash table to do duplicate checking
    bool toUseHashTable = false;

	setAttrDupChkRegistry(attCount, toUseHashTable);
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // check for duplicate namespace attributes:
        // by checking for qualified names with the same local part and with prefixes
        // which have been bound to namespace names that are identical.
        XMLAttr* curAttr = theAttrList->elementAt(index);
        if (!toUseHashTable)
        {
            XMLAttr* loopAttr;
            for (XMLSize_t attrIndex=0; attrIndex < index; attrIndex++) {
                loopAttr = theAttrList->elementAt(attrIndex);
                if (loopAttr->getURIId() == curAttr->getURIId() &&
                    XMLString::equals(loopAttr->getName(), curAttr->getName())) {
                    emitError(
                        XMLErrs::AttrAlreadyUsedInSTag, curAttr->getName()
                        , elemDecl->getFullName()
                    );
                }
            }
        }
        else
        {
            if (fAttrDupChkRegistry->containsKey((void*)curAttr->getName(), curAttr->getURIId()))
            {
                emitError(
                    XMLErrs::AttrAlreadyUsedInSTag
                    , curAttr->getName(), elemDecl->getFullName()
                );
            }

            fAttrDupChkRegistry->put((void*)curAttr->getName(), curAttr->getURIId(), curAttr);
        }
    }
}